

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void checker(void)

{
  int *piVar1;
  int iVar2;
  int v;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar4 = 0;
  uVar7 = (ulong)(uint)size;
  if (size < 1) {
    uVar7 = uVar4;
  }
  iVar5 = 0;
  while (uVar7 != uVar4) {
    if ((P.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      uVar4 = uVar4 + 1;
    }
    else {
      piVar1 = NAdjP + uVar4;
      lVar8 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      for (lVar6 = (long)*piVar1; lVar6 < NAdjP[lVar8]; lVar6 = lVar6 + 1) {
        iVar5 = iVar5 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6] >>
                                ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
      }
    }
  }
  if (iVar5 >> 1 != CE_P_P) {
    __assert_fail("re_CE_P_P == CE_P_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x13b,"void checker()");
  }
  uVar4 = 0;
  iVar5 = 0;
  while (uVar7 != uVar4) {
    if ((Cp.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      uVar4 = uVar4 + 1;
    }
    else {
      piVar1 = NAdjP + uVar4;
      lVar8 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      for (lVar6 = (long)*piVar1; lVar6 < NAdjP[lVar8]; lVar6 = lVar6 + 1) {
        iVar5 = iVar5 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6] >>
                                ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
      }
    }
  }
  if (iVar5 != CE_Cp_P) {
    __assert_fail("re_CE_Cp_P == CE_Cp_P",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x141,"void checker()");
  }
  uVar4 = 0;
  iVar5 = 0;
  while (uVar7 != uVar4) {
    if ((Cp.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      uVar4 = uVar4 + 1;
    }
    else {
      piVar1 = NAdjP + uVar4;
      lVar8 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      for (lVar6 = (long)*piVar1; lVar6 < NAdjP[lVar8]; lVar6 = lVar6 + 1) {
        iVar5 = iVar5 + (uint)((Cp.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6] >>
                                ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
      }
    }
  }
  if (iVar5 >> 1 != CE_Cp_Cp) {
    __assert_fail("re_CE_Cp_Cp == CE_Cp_Cp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x148,"void checker()");
  }
  uVar4 = 0;
  iVar5 = 0;
  while (uVar7 != uVar4) {
    if ((Cm.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
      uVar4 = uVar4 + 1;
    }
    else {
      piVar1 = NAdjP + uVar4;
      lVar8 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      for (lVar6 = (long)*piVar1; lVar6 < NAdjP[lVar8]; lVar6 = lVar6 + 1) {
        iVar5 = iVar5 + (uint)((Cp.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6] >>
                                ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
      }
    }
  }
  if (iVar5 == CE_Cm_Cp) {
    uVar4 = 0;
    iVar5 = 0;
    while (uVar7 != uVar4) {
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
        uVar4 = uVar4 + 1;
      }
      else {
        piVar1 = NAdjP + uVar4;
        lVar8 = uVar4 + 1;
        uVar4 = uVar4 + 1;
        for (lVar6 = (long)*piVar1; lVar6 < NAdjP[lVar8]; lVar6 = lVar6 + 1) {
          iVar5 = iVar5 + (uint)((Cm.super__Base_bitset<235UL>._M_w[(ulong)(long)NAdjB[lVar6] >> 6]
                                  >> ((long)NAdjB[lVar6] & 0x3fU) & 1) != 0);
        }
      }
    }
    if (iVar5 >> 1 != CE_Cm_Cm) {
      __assert_fail("re_CE_Cm_Cm == CE_Cm_Cm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x155,"void checker()");
    }
    uVar4 = 0;
    while (uVar4 != uVar7) {
      iVar5 = 0;
      for (lVar8 = (long)AdjP[uVar4]; lVar8 < AdjP[uVar4 + 1]; lVar8 = lVar8 + 1) {
        iVar2 = AdjB[lVar8];
        uVar9 = (ulong)(long)iVar2 >> 6;
        uVar3 = 1;
        if ((Cp.super__Base_bitset<235UL>._M_w[uVar9] >> ((long)iVar2 & 0x3fU) & 1) == 0) {
          uVar3 = (uint)((Cm.super__Base_bitset<235UL>._M_w[uVar9] & 1L << ((byte)iVar2 & 0x3f)) !=
                        0);
        }
        iVar5 = iVar5 + uVar3;
      }
      piVar1 = neiC + uVar4;
      uVar4 = uVar4 + 1;
      if (iVar5 != *piVar1) {
        __assert_fail("re_neiC == neiC[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                      ,0x15b,"void checker()");
      }
    }
    uVar4 = 0;
    while (uVar4 != uVar7) {
      iVar5 = 0;
      for (lVar8 = (long)AdjP[uVar4]; lVar8 < AdjP[uVar4 + 1]; lVar8 = lVar8 + 1) {
        iVar5 = iVar5 + (uint)((P.super__Base_bitset<235UL>._M_w[(ulong)(long)AdjB[lVar8] >> 6] >>
                                ((long)AdjB[lVar8] & 0x3fU) & 1) != 0);
      }
      piVar1 = neiP + uVar4;
      uVar4 = uVar4 + 1;
      if (iVar5 != *piVar1) {
        __assert_fail("re_neiP == neiP[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                      ,0x162,"void checker()");
      }
    }
    iVar5 = 0;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = 1;
      if ((Cm.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
        uVar3 = (uint)((Cp.super__Base_bitset<235UL>._M_w[uVar4 >> 6] & 1L << ((byte)uVar4 & 0x3f))
                      != 0);
      }
      iVar5 = iVar5 + uVar3;
    }
    if (iVar5 == sizeC) {
      iVar5 = 0;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        iVar5 = iVar5 + (uint)((P.super__Base_bitset<235UL>._M_w[uVar4 >> 6] >> (uVar4 & 0x3f) & 1)
                              != 0);
      }
      if (iVar5 == sizeP) {
        return;
      }
      __assert_fail("re_sizeP == sizeP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                    ,0x16d,"void checker()");
    }
    __assert_fail("re_sizeC == sizeC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                  ,0x168,"void checker()");
  }
  __assert_fail("re_CE_Cm_Cp == CE_Cm_Cp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenxiaoyu233[P]k-defective/MADEC-CORE.cpp"
                ,0x14e,"void checker()");
}

Assistant:

void checker() {
    /* CE_P_P */
    int re_CE_P_P = 0;
    for (int v = 0; v < size; ++v) if (P[v])
        FOR_C_NP(v, u) re_CE_P_P += 1;
    re_CE_P_P >>= 1;
    assert(re_CE_P_P == CE_P_P);

    /* CE_Cp_P */
    int re_CE_Cp_P = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NP(v, u) re_CE_Cp_P += 1;
    assert(re_CE_Cp_P == CE_Cp_P);

    /* CE_Cp_Cp */
    int re_CE_Cp_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cp[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cp_Cp;
    re_CE_Cp_Cp >>= 1;
    assert(re_CE_Cp_Cp == CE_Cp_Cp);

    /* CE_Cm_Cp */
    int re_CE_Cm_Cp = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cp[u]) ++re_CE_Cm_Cp;
    assert(re_CE_Cm_Cp == CE_Cm_Cp);

    /* CE_Cm_Cm */
    int re_CE_Cm_Cm = 0;
    for (int v = 0; v < size; ++v)
        if (Cm[v]) FOR_C_NA(v, u) if (Cm[u]) ++re_CE_Cm_Cm;
    re_CE_Cm_Cm >>= 1;
    assert(re_CE_Cm_Cm == CE_Cm_Cm);

    /* neiC */
    for (int v = 0; v < size; ++v) {
        int re_neiC = 0;
        FOR_NC(v, u) re_neiC += 1;
        assert(re_neiC == neiC[v]);
    }

    /* neiP */
    for (int v = 0; v < size; ++v) {
        int re_neiP = 0;
        FOR_NP(v, u) re_neiP += 1;
        assert(re_neiP == neiP[v]);
    }

    /* sizeC */
    int re_sizeC = 0;
    for (int v = 0; v < size; ++v) if(Cm[v] || Cp[v]) ++re_sizeC;
    assert(re_sizeC == sizeC);

    /* sizeP */
    int re_sizeP = 0;
    for (int v = 0; v < size; ++v) if (P[v]) ++re_sizeP;
    assert(re_sizeP == sizeP);
}